

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_real_equal_real(void)

{
  undefined1 local_fc9;
  basic_variable<std::allocator<char>_> local_fc8;
  basic_variable<std::allocator<char>_> local_f98;
  undefined1 local_f5b [2];
  undefined1 local_f59;
  basic_variable<std::allocator<char>_> local_f58;
  basic_variable<std::allocator<char>_> local_f28;
  undefined1 local_eeb [2];
  undefined1 local_ee9;
  basic_variable<std::allocator<char>_> local_ee8;
  basic_variable<std::allocator<char>_> local_eb8;
  undefined1 local_e7b [2];
  undefined1 local_e79;
  basic_variable<std::allocator<char>_> local_e78;
  basic_variable<std::allocator<char>_> local_e48;
  undefined1 local_e0b [2];
  undefined1 local_e09;
  basic_variable<std::allocator<char>_> local_e08;
  basic_variable<std::allocator<char>_> local_dd8;
  undefined1 local_d9b [2];
  undefined1 local_d99;
  basic_variable<std::allocator<char>_> local_d98;
  basic_variable<std::allocator<char>_> local_d68;
  undefined1 local_d2b [2];
  undefined1 local_d29;
  basic_variable<std::allocator<char>_> local_d28;
  basic_variable<std::allocator<char>_> local_cf8;
  undefined1 local_cbb [2];
  undefined1 local_cb9;
  basic_variable<std::allocator<char>_> local_cb8;
  basic_variable<std::allocator<char>_> local_c88;
  undefined1 local_c4b [2];
  undefined1 local_c49;
  basic_variable<std::allocator<char>_> local_c48;
  basic_variable<std::allocator<char>_> local_c18;
  undefined1 local_bdb [2];
  undefined1 local_bd9;
  basic_variable<std::allocator<char>_> local_bd8;
  basic_variable<std::allocator<char>_> local_ba8;
  undefined1 local_b6b [2];
  undefined1 local_b69;
  basic_variable<std::allocator<char>_> local_b68;
  basic_variable<std::allocator<char>_> local_b38;
  undefined1 local_afb [2];
  undefined1 local_af9;
  basic_variable<std::allocator<char>_> local_af8;
  basic_variable<std::allocator<char>_> local_ac8;
  undefined1 local_a8b [2];
  undefined1 local_a89;
  basic_variable<std::allocator<char>_> local_a88;
  basic_variable<std::allocator<char>_> local_a58;
  undefined1 local_a1b [2];
  undefined1 local_a19;
  basic_variable<std::allocator<char>_> local_a18;
  basic_variable<std::allocator<char>_> local_9e8;
  undefined1 local_9ab [2];
  undefined1 local_9a9;
  basic_variable<std::allocator<char>_> local_9a8;
  basic_variable<std::allocator<char>_> local_978;
  undefined1 local_93b [2];
  undefined1 local_939;
  basic_variable<std::allocator<char>_> local_938;
  basic_variable<std::allocator<char>_> local_908;
  undefined1 local_8cb [2];
  undefined1 local_8c9;
  basic_variable<std::allocator<char>_> local_8c8;
  basic_variable<std::allocator<char>_> local_898;
  undefined1 local_85b [2];
  undefined1 local_859;
  basic_variable<std::allocator<char>_> local_858;
  basic_variable<std::allocator<char>_> local_828;
  undefined1 local_7eb [2];
  undefined1 local_7e9;
  basic_variable<std::allocator<char>_> local_7e8;
  basic_variable<std::allocator<char>_> local_7b8;
  undefined1 local_77b [2];
  undefined1 local_779;
  basic_variable<std::allocator<char>_> local_778;
  basic_variable<std::allocator<char>_> local_748;
  undefined1 local_70b [2];
  undefined1 local_709;
  basic_variable<std::allocator<char>_> local_708;
  basic_variable<std::allocator<char>_> local_6d8;
  undefined1 local_69b [2];
  undefined1 local_699;
  basic_variable<std::allocator<char>_> local_698;
  basic_variable<std::allocator<char>_> local_668;
  undefined1 local_62b [2];
  undefined1 local_629;
  basic_variable<std::allocator<char>_> local_628;
  basic_variable<std::allocator<char>_> local_5f8;
  undefined1 local_5bb [2];
  undefined1 local_5b9;
  basic_variable<std::allocator<char>_> local_5b8;
  basic_variable<std::allocator<char>_> local_588;
  undefined1 local_54b [2];
  undefined1 local_549;
  basic_variable<std::allocator<char>_> local_548;
  basic_variable<std::allocator<char>_> local_518;
  undefined1 local_4db [2];
  undefined1 local_4d9;
  basic_variable<std::allocator<char>_> local_4d8;
  basic_variable<std::allocator<char>_> local_4a8;
  undefined1 local_46b [2];
  undefined1 local_469;
  basic_variable<std::allocator<char>_> local_468;
  basic_variable<std::allocator<char>_> local_438;
  undefined1 local_3fb [2];
  undefined1 local_3f9;
  basic_variable<std::allocator<char>_> local_3f8;
  basic_variable<std::allocator<char>_> local_3c8;
  undefined1 local_38b [2];
  undefined1 local_389;
  basic_variable<std::allocator<char>_> local_388;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31b [2];
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  undefined1 local_2ab [2];
  undefined1 local_2a9;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  undefined1 local_23b [2];
  undefined1 local_239;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_48,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_78,0.0);
  local_a[0] = trial::dynamic::operator==(&local_48,&local_78);
  local_85[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == variable(0.0f)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x56a,"void equality_suite::compare_real_equal_real()",local_a,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_b8,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_e8,0.0);
  local_87[0] = trial::dynamic::operator!=(&local_b8,&local_e8);
  local_e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != variable(0.0f)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x56b,"void equality_suite::compare_real_equal_real()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_128,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_158,1.0);
  local_eb[0] = trial::dynamic::operator==(&local_128,&local_158);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == variable(1.0f)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x56c,"void equality_suite::compare_real_equal_real()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_198,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_1c8,1.0);
  local_15b[0] = trial::dynamic::operator!=(&local_198,&local_1c8);
  local_1c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != variable(1.0f)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x56d,"void equality_suite::compare_real_equal_real()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_208,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_238,0.0);
  local_1cb[0] = trial::dynamic::operator==(&local_208,&local_238);
  local_239 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == variable(0.0)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x571,"void equality_suite::compare_real_equal_real()",local_1cb,&local_239);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_278,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_2a8,0.0);
  local_23b[0] = trial::dynamic::operator!=(&local_278,&local_2a8);
  local_2a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != variable(0.0)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x572,"void equality_suite::compare_real_equal_real()",local_23b,&local_2a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_2e8,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_318,1.0);
  local_2ab[0] = trial::dynamic::operator==(&local_2e8,&local_318);
  local_319 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == variable(1.0)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x573,"void equality_suite::compare_real_equal_real()",local_2ab,&local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_358,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_388,1.0);
  local_31b[0] = trial::dynamic::operator!=(&local_358,&local_388);
  local_389 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != variable(1.0)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x574,"void equality_suite::compare_real_equal_real()",local_31b,&local_389);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_3c8,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_3f8,(longdouble)0);
  local_38b[0] = trial::dynamic::operator==(&local_3c8,&local_3f8);
  local_3f9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == variable(0.0L)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x578,"void equality_suite::compare_real_equal_real()",local_38b,&local_3f9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_438,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_468,(longdouble)0);
  local_3fb[0] = trial::dynamic::operator!=(&local_438,&local_468);
  local_469 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != variable(0.0L)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x579,"void equality_suite::compare_real_equal_real()",local_3fb,&local_469);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_468);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_438);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_4a8,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_4d8,(longdouble)1);
  local_46b[0] = trial::dynamic::operator==(&local_4a8,&local_4d8);
  local_4d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == variable(1.0L)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x57a,"void equality_suite::compare_real_equal_real()",local_46b,&local_4d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_518,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_548,(longdouble)1);
  local_4db[0] = trial::dynamic::operator!=(&local_518,&local_548);
  local_549 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != variable(1.0L)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x57b,"void equality_suite::compare_real_equal_real()",local_4db,&local_549);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_548);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_588,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_5b8,0.0);
  local_54b[0] = trial::dynamic::operator==(&local_588,&local_5b8);
  local_5b9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == variable(0.0f)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x57f,"void equality_suite::compare_real_equal_real()",local_54b,&local_5b9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_588);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_5f8,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_628,0.0);
  local_5bb[0] = trial::dynamic::operator!=(&local_5f8,&local_628);
  local_629 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != variable(0.0f)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x580,"void equality_suite::compare_real_equal_real()",local_5bb,&local_629);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_628);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_668,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_698,1.0);
  local_62b[0] = trial::dynamic::operator==(&local_668,&local_698);
  local_699 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == variable(1.0f)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x581,"void equality_suite::compare_real_equal_real()",local_62b,&local_699);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_698);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_668);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_6d8,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_708,1.0);
  local_69b[0] = trial::dynamic::operator!=(&local_6d8,&local_708);
  local_709 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != variable(1.0f)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x582,"void equality_suite::compare_real_equal_real()",local_69b,&local_709);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_708);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_748,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_778,0.0);
  local_70b[0] = trial::dynamic::operator==(&local_748,&local_778);
  local_779 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == variable(0.0)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x586,"void equality_suite::compare_real_equal_real()",local_70b,&local_779);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_778);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_748);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_7b8,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_7e8,0.0);
  local_77b[0] = trial::dynamic::operator!=(&local_7b8,&local_7e8);
  local_7e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != variable(0.0)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x587,"void equality_suite::compare_real_equal_real()",local_77b,&local_7e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_828,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_858,1.0);
  local_7eb[0] = trial::dynamic::operator==(&local_828,&local_858);
  local_859 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == variable(1.0)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x588,"void equality_suite::compare_real_equal_real()",local_7eb,&local_859);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_828);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_898,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_8c8,1.0);
  local_85b[0] = trial::dynamic::operator!=(&local_898,&local_8c8);
  local_8c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != variable(1.0)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x589,"void equality_suite::compare_real_equal_real()",local_85b,&local_8c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_898);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_908,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_938,(longdouble)0);
  local_8cb[0] = trial::dynamic::operator==(&local_908,&local_938);
  local_939 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == variable(0.0L)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x58d,"void equality_suite::compare_real_equal_real()",local_8cb,&local_939);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_938);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_908);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_978,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_9a8,(longdouble)0);
  local_93b[0] = trial::dynamic::operator!=(&local_978,&local_9a8);
  local_9a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != variable(0.0L)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x58e,"void equality_suite::compare_real_equal_real()",local_93b,&local_9a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_978);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_9e8,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_a18,(longdouble)1);
  local_9ab[0] = trial::dynamic::operator==(&local_9e8,&local_a18);
  local_a19 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == variable(1.0L)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x58f,"void equality_suite::compare_real_equal_real()",local_9ab,&local_a19);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a18);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_a58,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_a88,(longdouble)1);
  local_a1b[0] = trial::dynamic::operator!=(&local_a58,&local_a88);
  local_a89 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != variable(1.0L)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x590,"void equality_suite::compare_real_equal_real()",local_a1b,&local_a89);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a88);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a58);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_ac8,(longdouble)0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_af8,0.0);
  local_a8b[0] = trial::dynamic::operator==(&local_ac8,&local_af8);
  local_af9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == variable(0.0f)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x594,"void equality_suite::compare_real_equal_real()",local_a8b,&local_af9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_af8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_ac8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_b38,(longdouble)0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_b68,0.0);
  local_afb[0] = trial::dynamic::operator!=(&local_b38,&local_b68);
  local_b69 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != variable(0.0f)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x595,"void equality_suite::compare_real_equal_real()",local_afb,&local_b69);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_ba8,(longdouble)0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_bd8,1.0);
  local_b6b[0] = trial::dynamic::operator==(&local_ba8,&local_bd8);
  local_bd9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == variable(1.0f)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x596,"void equality_suite::compare_real_equal_real()",local_b6b,&local_bd9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_bd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_ba8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_c18,(longdouble)0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_c48,1.0);
  local_bdb[0] = trial::dynamic::operator!=(&local_c18,&local_c48);
  local_c49 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != variable(1.0f)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x597,"void equality_suite::compare_real_equal_real()",local_bdb,&local_c49);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c48);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c18);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_c88,(longdouble)0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_cb8,0.0);
  local_c4b[0] = trial::dynamic::operator==(&local_c88,&local_cb8);
  local_cb9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == variable(0.0)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x59b,"void equality_suite::compare_real_equal_real()",local_c4b,&local_cb9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_cb8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c88);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_cf8,(longdouble)0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_d28,0.0);
  local_cbb[0] = trial::dynamic::operator!=(&local_cf8,&local_d28);
  local_d29 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != variable(0.0)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x59c,"void equality_suite::compare_real_equal_real()",local_cbb,&local_d29);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_cf8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_d68,(longdouble)0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_d98,1.0);
  local_d2b[0] = trial::dynamic::operator==(&local_d68,&local_d98);
  local_d99 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == variable(1.0)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x59d,"void equality_suite::compare_real_equal_real()",local_d2b,&local_d99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d98);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_dd8,(longdouble)0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_e08,1.0);
  local_d9b[0] = trial::dynamic::operator!=(&local_dd8,&local_e08);
  local_e09 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != variable(1.0)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x59e,"void equality_suite::compare_real_equal_real()",local_d9b,&local_e09);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e08);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_dd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_e48,(longdouble)0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_e78,(longdouble)0);
  local_e0b[0] = trial::dynamic::operator==(&local_e48,&local_e78);
  local_e79 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == variable(0.0L)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5a2,"void equality_suite::compare_real_equal_real()",local_e0b,&local_e79);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_eb8,(longdouble)0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_ee8,(longdouble)0);
  local_e7b[0] = trial::dynamic::operator!=(&local_eb8,&local_ee8);
  local_ee9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != variable(0.0L)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5a3,"void equality_suite::compare_real_equal_real()",local_e7b,&local_ee9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_ee8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_eb8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_f28,(longdouble)0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_f58,(longdouble)1);
  local_eeb[0] = trial::dynamic::operator==(&local_f28,&local_f58);
  local_f59 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == variable(1.0L)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5a4,"void equality_suite::compare_real_equal_real()",local_eeb,&local_f59);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_f58);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_f28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_f98,(longdouble)0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_fc8,(longdouble)1);
  local_f5b[0] = trial::dynamic::operator!=(&local_f98,&local_fc8);
  local_fc9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != variable(1.0L)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x5a5,"void equality_suite::compare_real_equal_real()",local_f5b,&local_fc9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_fc8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_f98);
  return;
}

Assistant:

void compare_real_equal_real()
{
    // float - float
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == variable(0.0f), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != variable(0.0f), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == variable(1.0f), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != variable(1.0f), true);
    }
    // float - double
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == variable(0.0), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != variable(0.0), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == variable(1.0), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != variable(1.0), true);
    }
    // float - long double
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == variable(0.0L), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != variable(0.0L), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == variable(1.0L), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != variable(1.0L), true);
    }
    // double - float
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == variable(0.0f), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != variable(0.0f), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == variable(1.0f), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != variable(1.0f), true);
    }
    // double - double
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == variable(0.0), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != variable(0.0), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == variable(1.0), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != variable(1.0), true);
    }
    // double - long double
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == variable(0.0L), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != variable(0.0L), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == variable(1.0L), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != variable(1.0L), true);
    }
    // long double - float
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == variable(0.0f), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != variable(0.0f), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == variable(1.0f), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != variable(1.0f), true);
    }
    // long double - double
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == variable(0.0), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != variable(0.0), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == variable(1.0), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != variable(1.0), true);
    }
    // long double - long double
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == variable(0.0L), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != variable(0.0L), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == variable(1.0L), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != variable(1.0L), true);
    }
}